

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O1

void verify_vertical_up(Board *board,int row,int col,Ship *ship)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = (row - ship->length) + 1;
  if (-1 < (int)uVar1) {
    iVar2 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(board->matrix).
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar1].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data + (long)col * 0x20));
    if (iVar2 == 0) {
      uVar1 = row - ship->length;
      if ((-1 < (int)uVar1) &&
         (iVar2 = std::__cxx11::string::compare
                            ((char *)((long)col * 0x20 +
                                     *(long *)&(board->matrix).
                                               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar1].
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data)), iVar2 == 0)) {
        ship->sRow = row;
        ship->sCol = col;
LAB_00102937:
        ship->orientation = 'V';
        ship->direction = -2;
        return;
      }
      ship->sRow = row;
      ship->sCol = col;
      if (row < ship->length) goto LAB_00102937;
      goto LAB_001028db;
    }
  }
  ship->sRow = row;
  ship->sCol = col;
LAB_001028db:
  ship->orientation = 'N';
  ship->direction = 0;
  return;
}

Assistant:

void verify_vertical_up( Board *board, int row, int col, Ship *ship )
{
	/*! Verifies if the current position minus the rest of the ship
	 *	exceeds the left border of the matrix or touches another one
	 */
    if( ( row - ( ship->length - 1 ) >= 0 ) and ( board->matrix[row - ( ship->length - 1 ) ][col] == "~"  ) )
    {
        if( ( row - ship->length >= 0 ) and ( board->matrix[row - ship->length][col] == "~" ) ) 
        {
            ship->set_values( row, col, 'V', -2 );
        }
        else if( row - ship->length < 0 )
        {
            ship->set_values( row, col, 'V', -2 );
        }
        else
        {
            ship->set_values( row, col, 'N', 0 );
        }
        
    }
    else
    {
        ship->set_values( row, col, 'N', 0 );
    }
}